

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O1

void __thiscall
crnlib::threaded_resampler::threaded_resampler(threaded_resampler *this,task_pool *tp)

{
  this->m_pTask_pool = tp;
  (this->m_tmp_img).m_p = (vec<4U,_float> *)0x0;
  (this->m_tmp_img).m_size = 0;
  (this->m_tmp_img).m_capacity = 0;
  this->m_pParams = (params *)0x0;
  this->m_pX_contribs = (Contrib_List *)0x0;
  *(undefined8 *)((long)&this->m_pX_contribs + 4) = 0;
  *(undefined8 *)((long)&this->m_pY_contribs + 4) = 0;
  return;
}

Assistant:

threaded_resampler::threaded_resampler(task_pool& tp) :
        m_pTask_pool(&tp),
        m_pParams(nullptr),
        m_pX_contribs(nullptr),
        m_pY_contribs(nullptr),
        m_bytes_per_pixel(0)
    {
    }